

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

SurfaceInteraction * __thiscall
pbrt::Sphere::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Sphere *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  Float FVar1;
  float fVar2;
  bool bVar3;
  Transform *pTVar4;
  Transform *this_00;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  bool bVar9;
  float fVar10;
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  Vector3f wo_00;
  Vector3f dpdu;
  Vector3f dpdv;
  Point3f pHit;
  undefined8 local_1c8;
  undefined8 local_1a8;
  Point2f local_198;
  uint local_188;
  Tuple3<pbrt::Vector3,_float> local_160;
  Point3f local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  
  local_150.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_150.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_150.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar15 = *(undefined1 (*) [16])&this->phiMax;
  auVar29._4_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.z;
  auVar29._0_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.z;
  auVar29._8_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.z;
  auVar29._12_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.z;
  auVar18._0_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.z / this->radius;
  auVar18._4_12_ = auVar29._4_12_;
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar18);
  uVar8 = vcmpss_avx512f(auVar18,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar9 = (bool)((byte)uVar8 & 1);
  FVar1 = isect->phi;
  fVar27 = acosf((float)((uint)bVar9 * -0x40800000 + (uint)!bVar9 * auVar11._0_4_));
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  fVar2 = this->phiMax;
  auVar21._0_4_ = -fVar2;
  auVar21._4_4_ = 0x80000000;
  auVar21._8_4_ = 0x80000000;
  auVar21._12_4_ = 0x80000000;
  auVar5 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)(fVar27 - this->thetaZMin)),0x10);
  fVar7 = this->thetaZMax - this->thetaZMin;
  auVar19._4_4_ = fVar7;
  auVar19._0_4_ = fVar7;
  auVar19._8_4_ = fVar7;
  auVar19._12_4_ = fVar7;
  auVar11 = vblendps_avx(auVar19,auVar15,0xd);
  auVar5 = vdivps_avx(auVar5,auVar11);
  auVar31 = ZEXT816(0) << 0x20;
  auVar11 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_)));
  auVar11 = vmaxss_avx(auVar11,auVar31);
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  auVar30._8_8_ = 0;
  auVar30._0_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.x;
  auVar30._4_4_ = local_150.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)(auVar11._0_4_ * -this->radius)));
  auVar11 = vmovshdup_avx(auVar30);
  fVar28 = local_150.super_Tuple3<pbrt::Point3,_float>.x;
  auVar13 = vmulss_avx512f(auVar30,ZEXT416((uint)fVar2));
  fVar33 = auVar11._0_4_;
  auVar14 = vmulss_avx512f(auVar11,auVar21);
  fVar27 = fVar2 * auVar21._0_4_;
  auVar11 = ZEXT416((uint)(fVar28 * fVar28 + fVar33 * fVar33));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  auVar11._4_4_ = auVar11._0_4_;
  auVar11._8_4_ = auVar11._0_4_;
  auVar11._12_4_ = auVar11._0_4_;
  auVar11 = vdivps_avx(auVar30,auVar11);
  auVar15 = vmulps_avx512vl(auVar11,auVar29);
  auVar16 = vmulps_avx512vl(auVar19,auVar15);
  auVar15 = vmulss_avx512f(ZEXT416((uint)fVar7),auVar29);
  fVar7 = fVar7 * -fVar7;
  auVar17 = vmulss_avx512f(auVar13,auVar13);
  fVar2 = fVar2 * auVar15._0_4_;
  auVar15 = vmovshdup_avx(auVar11);
  auVar18 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar7));
  auVar19 = vmovshdup_avx512vl(auVar16);
  auVar20 = vfmadd231ss_avx512f(auVar17,auVar14,auVar14);
  fVar32 = auVar19._0_4_;
  auVar17 = vmulss_avx512f(auVar13,auVar19);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar14,auVar16);
  auVar21 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar32 * fVar32)),auVar16,auVar16);
  auVar22 = vmulss_avx512f(auVar19,auVar31);
  auVar23 = vfmsub213ss_avx512f(auVar12,auVar13,auVar22);
  auVar22 = vfmadd213ss_avx512f(auVar24,auVar19,auVar22);
  auVar24 = vmulss_avx512f(auVar14,auVar12);
  auVar25 = vfmadd231ss_avx512f(auVar17,auVar12,auVar31);
  auVar26 = vfmadd231ss_avx512f(auVar21,auVar12,auVar12);
  auVar17 = vaddss_avx512f(auVar23,auVar22);
  auVar21 = vxorps_avx512vl(auVar23,auVar23);
  auVar21 = vfmsub213ss_avx512f(auVar21,auVar16,auVar24);
  auVar22 = vfnmadd231ss_avx512f(auVar24,auVar14,auVar12);
  auVar21 = vaddss_avx512f(auVar21,auVar22);
  auVar22 = vmulss_avx512f(auVar13,auVar16);
  auVar19 = vfmsub213ss_avx512f(auVar19,auVar14,auVar22);
  auVar22 = vfnmadd231ss_avx512f(auVar22,auVar13,auVar16);
  auVar23 = vmulss_avx512f(auVar21,auVar21);
  auVar19 = vaddss_avx512f(auVar19,auVar22);
  auVar22 = vmulss_avx512f(auVar17,auVar17);
  auVar22 = vaddss_avx512f(auVar22,auVar23);
  auVar23 = vmulss_avx512f(auVar19,auVar19);
  auVar22 = vaddss_avx512f(auVar23,auVar22);
  auVar22 = vsqrtss_avx512f(auVar22,auVar22);
  auVar21 = vdivss_avx512f(auVar21,auVar22);
  auVar17 = vdivss_avx512f(auVar17,auVar22);
  auVar19 = vdivss_avx512f(auVar19,auVar22);
  auVar11 = vmulss_avx512f(ZEXT416((uint)(auVar11._0_4_ * fVar2)),auVar21);
  auVar22 = vmulss_avx512f(ZEXT416((uint)(fVar33 * fVar27)),auVar21);
  auVar22 = vfmadd231ss_avx512f(auVar22,auVar17,ZEXT416((uint)(fVar28 * fVar27)));
  auVar11 = vfnmadd231ss_avx512f(auVar11,auVar17,ZEXT416((uint)(fVar2 * auVar15._0_4_)));
  auVar15 = vmulss_avx512f(ZEXT416((uint)(fVar33 * fVar7)),auVar21);
  auVar15 = vfmadd231ss_avx512f(auVar15,auVar17,ZEXT416((uint)(fVar28 * fVar7)));
  auVar23 = vfmadd231ss_avx512f(auVar11,auVar19,ZEXT416((uint)(fVar2 * 0.0)));
  auVar17 = vfmadd231ss_avx512f(auVar22,auVar19,ZEXT416((uint)(fVar27 * 0.0)));
  auVar19 = vfmadd231ss_avx512f(auVar15,auVar19,auVar18);
  auVar15 = ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_));
  auVar11 = vfmsub213ss_fma(auVar26,auVar20,auVar15);
  auVar21 = vfnmadd231ss_fma(auVar15,auVar25,auVar25);
  auVar15 = vfmsub231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar26._0_4_)),auVar23,auVar25);
  auVar17 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar23._0_4_)),auVar25,auVar17);
  auVar18 = vfmsub231ss_fma(ZEXT416((uint)(auVar26._0_4_ * auVar23._0_4_)),auVar19,auVar25);
  auVar19 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar19._0_4_)),auVar25,auVar23);
  auVar21 = ZEXT416((uint)(auVar21._0_4_ + auVar11._0_4_));
  auVar11 = vdivss_avx512f(ZEXT416(0x3f800000),auVar21);
  uVar8 = vcmpss_avx512f(auVar21,auVar31,0);
  fVar10 = (float)((uint)!(bool)((byte)uVar8 & 1) * auVar11._0_4_);
  fVar28 = fVar10 * auVar15._0_4_;
  fVar33 = fVar10 * auVar17._0_4_;
  fVar6 = fVar10 * auVar19._0_4_;
  fVar10 = fVar10 * auVar18._0_4_;
  auVar18 = vmulss_avx512f(auVar14,ZEXT416((uint)fVar28));
  auVar19 = vmulss_avx512f(auVar16,ZEXT416((uint)fVar33));
  auVar21 = vmulss_avx512f(auVar13,ZEXT416((uint)fVar28));
  auVar20 = vmulss_avx512f(auVar16,ZEXT416((uint)fVar6));
  auVar22 = vmulss_avx512f(auVar12,ZEXT416((uint)fVar33));
  auVar23 = vmulss_avx512f(auVar13,ZEXT416((uint)fVar10));
  auVar24 = vmulss_avx512f(auVar14,ZEXT416((uint)fVar10));
  auVar25 = vmulss_avx512f(auVar12,ZEXT416((uint)fVar6));
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx(auVar30,auVar17);
  auVar17 = vandps_avx512vl(auVar29,auVar17);
  auVar15._8_4_ = 0x34a00003;
  auVar15._0_8_ = 0x34a0000334a00003;
  auVar15._12_4_ = 0x34a00003;
  auVar11 = vmulps_avx512vl(auVar11,auVar15);
  local_160.z = auVar17._0_4_ * 2.980233e-07;
  local_160._0_8_ = vmovlps_avx(auVar11);
  pTVar4 = this->objectFromRender;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar27 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar7 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  bVar9 = this->reverseOrientation;
  this_00 = this->renderFromObject;
  bVar3 = this->transformSwapsHandedness;
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (pTVar4->m).m[0][1])),ZEXT416((uint)fVar27),
                            ZEXT416((uint)(pTVar4->m).m[0][0]));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (pTVar4->m).m[1][1])),ZEXT416((uint)fVar27),
                            ZEXT416((uint)(pTVar4->m).m[1][0]));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (pTVar4->m).m[2][1])),ZEXT416((uint)fVar27),
                            ZEXT416((uint)(pTVar4->m).m[2][0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[0][2]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[1][2]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar7),ZEXT416((uint)(pTVar4->m).m[2][2]));
  auVar11 = vinsertps_avx(auVar11,auVar15,0x10);
  Point3fi::Point3fi(&local_140,&local_150,(Vector3f *)&local_160);
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = auVar23._0_4_ + fVar32 * fVar6;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = auVar24._0_4_ + auVar20._0_4_;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = auVar21._0_4_ + fVar33 * fVar32;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = auVar18._0_4_ + auVar19._0_4_;
  local_1c8 = auVar11._0_8_;
  local_1a8 = auVar16._0_8_;
  local_188 = auVar13._0_4_;
  auVar11 = vinsertps_avx(auVar14,ZEXT416(local_188),0x10);
  local_198.super_Tuple2<pbrt::Point2,_float> = auVar5._0_8_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = auVar22._0_4_ + fVar28 * 0.0;
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar10 * 0.0 + auVar25._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1c8;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1c8._4_4_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = auVar12._0_4_;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_1a8;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1a8._4_4_;
  SurfaceInteraction::SurfaceInteraction
            (&local_128,pi,local_198,wo_00,dpdu,dpdv,dndu,dndv,time,bVar9 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of sphere hit
        Float u = phi / phiMax;
        Float cosTheta = pHit.z / radius;
        Float theta = SafeACos(cosTheta);
        Float v = (theta - thetaZMin) / (thetaZMax - thetaZMin);
        // Compute sphere $\dpdu$ and $\dpdv$
        Float zRadius = std::sqrt(Sqr(pHit.x) + Sqr(pHit.y));
        Float cosPhi = pHit.x / zRadius;
        Float sinPhi = pHit.y / zRadius;
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
        Vector3f dpdv = (thetaZMax - thetaZMin) *
                        Vector3f(pHit.z * cosPhi, pHit.z * sinPhi, -radius * sinTheta);

        // Compute sphere $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv =
            (thetaZMax - thetaZMin) * pHit.z * phiMax * Vector3f(-sinPhi, cosPhi, 0.);
        Vector3f d2Pdvv = -Sqr(thetaZMax - thetaZMin) * Vector3f(pHit.x, pHit.y, pHit.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for sphere intersection
        Vector3f pError = gamma(5) * Abs((Vector3f)pHit);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }